

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool GlobOpt::IsSwitchOptEnabled(Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  
  if (func->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3da2,"(func->IsTopFunc())","func->IsTopFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,SwitchOptPhase,sourceContextId,functionId);
  if (!bVar2) {
    bVar2 = Func::IsSwitchOptDisabled(func);
    if (!bVar2) {
      bVar2 = Func::DoGlobOpt(func);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsSwitchOptEnabled(Func const * func)
{
    Assert(func->IsTopFunc());
    return !PHASE_OFF(Js::SwitchOptPhase, func) && !func->IsSwitchOptDisabled() && func->DoGlobOpt();
}